

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int bsetstr(bstring b0,int pos,const_bstring b1,uchar fill)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  bstring local_38;
  
  iVar5 = -1;
  if (((b0 != (bstring)0x0 && -1 < pos) && (-1 < b0->slen)) && (b0->data != (uchar *)0x0)) {
    uVar3 = b0->mlen;
    if (0 < (int)uVar3 && b0->slen <= (int)uVar3) {
      if (b1 == (const_bstring)0x0) {
        local_38 = (bstring)0x0;
        uVar3 = pos;
      }
      else {
        iVar1 = b1->slen;
        if (iVar1 < 0) {
          return -1;
        }
        if (b1->data == (uchar *)0x0) {
          return -1;
        }
        uVar2 = (long)b1->data - (long)b0->data;
        local_38 = b1;
        if (uVar2 < uVar3 && -1 < (long)uVar2) {
          local_38 = bstrcpy(b1);
          if (local_38 == (bstring)0x0) {
            return -1;
          }
          iVar1 = local_38->slen;
        }
        uVar3 = iVar1 + pos;
      }
      iVar1 = balloc(b0,uVar3 + 1);
      if (iVar1 == 0) {
        uVar4 = b0->slen;
        if (pos - uVar4 != 0 && (int)uVar4 <= pos) {
          memset(b0->data + (int)uVar4,(uint)fill,(long)(int)(pos - uVar4));
          uVar4 = pos;
        }
        if (local_38 != (bstring)0x0) {
          if (0 < (long)local_38->slen) {
            memmove(b0->data + (uint)pos,local_38->data,(long)local_38->slen);
          }
          if (local_38 != b1) {
            bdestroy(local_38);
          }
        }
        if ((int)uVar4 < (int)uVar3) {
          uVar4 = uVar3;
        }
        b0->slen = uVar4;
        b0->data[uVar4] = '\0';
        iVar5 = 0;
      }
      else if (local_38 != b1) {
        bdestroy(local_38);
      }
    }
  }
  return iVar5;
}

Assistant:

int bsetstr (bstring b0, int pos, const_bstring b1, unsigned char fill) {
int d, newlen;
ptrdiff_t pd;
bstring aux = (bstring) b1;

	if (pos < 0 || b0 == NULL || b0->slen < 0 || NULL == b0->data ||
	    b0->mlen < b0->slen || b0->mlen <= 0) return BSTR_ERR;
	if (b1 != NULL && (b1->slen < 0 || b1->data == NULL)) return BSTR_ERR;

	d = pos;

	/* Aliasing case */
	if (NULL != aux) {
		if ((pd = (ptrdiff_t) (b1->data - b0->data)) >= 0 &&
		    pd < (ptrdiff_t) b0->mlen) {
			if (NULL == (aux = bstrcpy (b1))) return BSTR_ERR;
		}
		d += aux->slen;
	}

	/* Increase memory size if necessary */
	if (balloc (b0, d + 1) != BSTR_OK) {
		if (aux != b1) bdestroy (aux);
		return BSTR_ERR;
	}

	newlen = b0->slen;

	/* Fill in "fill" character as necessary */
	if (pos > newlen) {
		bstr__memset (b0->data + b0->slen, (int) fill,
		              (size_t) (pos - b0->slen));
		newlen = pos;
	}

	/* Copy b1 to position pos in b0. */
	if (aux != NULL) {
		bBlockCopy ((char *) (b0->data + pos), (char *) aux->data, aux->slen);
		if (aux != b1) bdestroy (aux);
	}

	/* Indicate the potentially increased size of b0 */
	if (d > newlen) newlen = d;

	b0->slen = newlen;
	b0->data[newlen] = (unsigned char) '\0';

	return BSTR_OK;
}